

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O1

void __thiscall wasm::SuffixTree::setSuffixIndices(SuffixTree *this)

{
  uint Len;
  SuffixTreeLeafNode *this_00;
  size_t sVar1;
  undefined8 *puVar2;
  pair<wasm::SuffixTreeNode_*,_unsigned_int> local_58;
  pointer ppStack_48;
  vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ToVisit;
  
  ppStack_48 = (pointer)0x0;
  ToVisit.
  super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ToVisit.
  super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.first = &this->Root->super_SuffixTreeNode;
  local_58.second = 0;
  std::
  vector<std::pair<wasm::SuffixTreeNode*,unsigned_int>,std::allocator<std::pair<wasm::SuffixTreeNode*,unsigned_int>>>
  ::_M_realloc_insert<std::pair<wasm::SuffixTreeNode*,unsigned_int>>
            ((vector<std::pair<wasm::SuffixTreeNode*,unsigned_int>,std::allocator<std::pair<wasm::SuffixTreeNode*,unsigned_int>>>
              *)&ppStack_48,(iterator)0x0,&local_58);
  if (ppStack_48 !=
      ToVisit.
      super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      this_00 = (SuffixTreeLeafNode *)
                ToVisit.
                super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].first;
      Len = ToVisit.
            super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].second;
      ToVisit.
      super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           ToVisit.
           super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
      SuffixTreeNode::setConcatLen((SuffixTreeNode *)this_00,Len);
      if ((this_00->super_SuffixTreeNode).Kind == ST_Internal) {
        for (puVar2 = *(undefined8 **)&this_00[1].super_SuffixTreeNode.ConcatLen;
            puVar2 != (undefined8 *)0x0; puVar2 = (undefined8 *)*puVar2) {
          if ((SuffixTreeNode *)puVar2[2] == (SuffixTreeNode *)0x0) {
            __assert_fail("ChildPair.second && \"Node had a null child!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                          ,0x6c,"void wasm::SuffixTree::setSuffixIndices()");
          }
          sVar1 = numElementsInSubstring((SuffixTreeNode *)puVar2[2]);
          local_58.first = (SuffixTreeNode *)puVar2[2];
          local_58.second = (int)sVar1 + Len;
          if (ToVisit.
              super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              ToVisit.
              super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<wasm::SuffixTreeNode*,unsigned_int>,std::allocator<std::pair<wasm::SuffixTreeNode*,unsigned_int>>>
            ::_M_realloc_insert<std::pair<wasm::SuffixTreeNode*,unsigned_int>>
                      ((vector<std::pair<wasm::SuffixTreeNode*,unsigned_int>,std::allocator<std::pair<wasm::SuffixTreeNode*,unsigned_int>>>
                        *)&ppStack_48,
                       (iterator)
                       ToVisit.
                       super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&local_58);
          }
          else {
            (ToVisit.
             super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = local_58.first;
            *(ulong *)&(ToVisit.
                        super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second =
                 CONCAT44(local_58._12_4_,local_58.second);
            ToVisit.
            super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 ToVisit.
                 super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
      }
      if ((this_00->super_SuffixTreeNode).Kind == ST_Leaf) {
        SuffixTreeLeafNode::setSuffixIdx
                  (this_00,(int)((ulong)((long)(this->Str).
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->Str).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2) - Len
                  );
      }
    } while (ppStack_48 !=
             ToVisit.
             super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  if (ppStack_48 != (pointer)0x0) {
    operator_delete(ppStack_48,
                    (long)ToVisit.
                          super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_48);
  }
  return;
}

Assistant:

void SuffixTree::setSuffixIndices() {
  // List of nodes we need to visit along with the current length of the
  // string.
  std::vector<std::pair<SuffixTreeNode*, unsigned>> ToVisit;

  // Current node being visited.
  SuffixTreeNode* CurrNode = Root;

  // Sum of the lengths of the nodes down the path to the current one.
  unsigned CurrNodeLen = 0;
  ToVisit.push_back({CurrNode, CurrNodeLen});
  while (!ToVisit.empty()) {
    std::tie(CurrNode, CurrNodeLen) = ToVisit.back();
    ToVisit.pop_back();
    // Length of the current node from the root down to here.
    CurrNode->setConcatLen(CurrNodeLen);
    if (auto* InternalNode = dyn_cast<SuffixTreeInternalNode>(CurrNode)) {
      for (auto& ChildPair : InternalNode->Children) {
        assert(ChildPair.second && "Node had a null child!");
        ToVisit.push_back(
          {ChildPair.second,
           CurrNodeLen + numElementsInSubstring(ChildPair.second)});
      }
    }
    // No children, so we are at the end of the string.
    if (auto* LeafNode = dyn_cast<SuffixTreeLeafNode>(CurrNode)) {
      LeafNode->setSuffixIdx(Str.size() - CurrNodeLen);
    }
  }
}